

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::TestRegistry::registerTest
          (TestRegistry *this,unique_ptr<Catch::TestCaseInfo> *testInfo,
          unique_ptr<Catch::ITestInvoker> *testInvoker)

{
  TestCaseInfo *local_30;
  ITestInvoker *local_28;
  
  local_30 = testInfo->m_ptr;
  local_28 = testInvoker->m_ptr;
  std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>::
  emplace_back<Catch::TestCaseInfo*,Catch::ITestInvoker*>
            ((vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>> *)&this->m_handles
             ,&local_30,&local_28);
  local_30 = testInfo->m_ptr;
  std::vector<Catch::TestCaseInfo*,std::allocator<Catch::TestCaseInfo*>>::
  emplace_back<Catch::TestCaseInfo*>
            ((vector<Catch::TestCaseInfo*,std::allocator<Catch::TestCaseInfo*>> *)
             &this->m_viewed_test_infos,&local_30);
  std::
  vector<Catch::Detail::unique_ptr<Catch::TestCaseInfo>,std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseInfo>>>
  ::emplace_back<Catch::Detail::unique_ptr<Catch::TestCaseInfo>>
            ((vector<Catch::Detail::unique_ptr<Catch::TestCaseInfo>,std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseInfo>>>
              *)&this->m_owned_test_infos,testInfo);
  std::
  vector<Catch::Detail::unique_ptr<Catch::ITestInvoker>,std::allocator<Catch::Detail::unique_ptr<Catch::ITestInvoker>>>
  ::emplace_back<Catch::Detail::unique_ptr<Catch::ITestInvoker>>
            ((vector<Catch::Detail::unique_ptr<Catch::ITestInvoker>,std::allocator<Catch::Detail::unique_ptr<Catch::ITestInvoker>>>
              *)&this->m_invokers,testInvoker);
  return;
}

Assistant:

void TestRegistry::registerTest(Detail::unique_ptr<TestCaseInfo> testInfo, Detail::unique_ptr<ITestInvoker> testInvoker) {
        m_handles.emplace_back(testInfo.get(), testInvoker.get());
        m_viewed_test_infos.push_back(testInfo.get());
        m_owned_test_infos.push_back(CATCH_MOVE(testInfo));
        m_invokers.push_back(CATCH_MOVE(testInvoker));
    }